

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<char>::NFA(NFA<char> *this)

{
  CharClass<char> local_40;
  NFA<char> *local_10;
  NFA<char> *this_local;
  
  local_10 = this;
  NFABase<Centaurus::NFABaseState<char,_int>_>::NFABase
            (&this->super_NFABase<Centaurus::NFABaseState<char,_int>_>);
  (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFA_00255a98;
  std::
  vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>::
  emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states);
  CharClass<char>::CharClass(&local_40);
  add_state(this,&local_40);
  CharClass<char>::~CharClass(&local_40);
  return;
}

Assistant:

NFA()
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
    }